

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

uint __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::Rescan(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
         *this,Recycler *recycler,RescanFlags flags)

{
  BOOL BVar1;
  RescanFlags flags_local;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_local;
  
  BVar1 = Recycler::IsConcurrentMarkState(recycler);
  VerifyHeapBlockCount(this,BVar1 != 0);
  BVar1 = Recycler::IsConcurrentMarkState(recycler);
  if ((BVar1 == 0) && ((recycler->inEndMarkOnLowMemory & 1U) == 0)) {
    PrepareSweep(this);
  }
  return 0;
}

Assistant:

uint
HeapBucketT<TBlockType>::Rescan(Recycler * recycler, RescanFlags flags)
{
#if ENABLE_CONCURRENT_GC
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(!!recycler->IsConcurrentMarkState()));
#else
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(false /* background */));
#endif

#if ENABLE_CONCURRENT_GC
    // If we do the final rescan concurrently, the main thread will prepare for sweep concurrently
    // If we do rescan in thread, we will need to prepare sweep here.
    // However, if we are in the rescan for OOM, we have already done it, so no need to do it again
    if (!recycler->IsConcurrentMarkState() && !recycler->inEndMarkOnLowMemory)
    {
        this->PrepareSweep();
    }
#endif

    // By default heap bucket doesn't rescan anything
    return 0;
}